

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void Am_Put_Objects_Back_In_Place
               (Am_Object *group,Am_Value_List *objects,Am_Value_List *places,bool add_part)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  Am_Object *object_00;
  Am_Object place;
  Am_Object object;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object *local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  local_48 = group;
  uVar2 = Am_Value_List::Length(objects);
  uVar3 = Am_Value_List::Length(places);
  if (uVar2 != uVar3) {
    Am_Error("** Lists not the same length in put_back");
  }
  object.data = (Am_Object_Data *)0x0;
  place.data = (Am_Object_Data *)0x0;
  Am_Value_List::End(objects);
  Am_Value_List::End(places);
  do {
    bVar1 = Am_Value_List::First(objects);
    if (bVar1) {
      Am_Object::~Am_Object(&place);
      Am_Object::~Am_Object(&object);
      return;
    }
    pAVar4 = Am_Value_List::Get(objects);
    Am_Object::operator=(&object,pAVar4);
    pAVar4 = Am_Value_List::Get(places);
    Am_Object::operator=(&place,pAVar4);
    if (add_part) {
      Am_Object::Get_Owner(&local_50,(Am_Slot_Flags)&object);
      bVar1 = Am_Object::Valid(&local_50);
      Am_Object::~Am_Object(&local_50);
      if (!bVar1) {
        Am_Object::Am_Object(&local_58,&object);
        Am_Object::Add_Part(local_48,&local_58,true,0);
        Am_Object::~Am_Object(&local_58);
      }
    }
    bVar1 = Am_Object::Valid(&place);
    if (bVar1) {
      Am_Object::Get_Owner(&local_50,(Am_Slot_Flags)&place);
      Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&object);
      bVar1 = Am_Object::operator==(&local_50,&local_38);
      Am_Object::~Am_Object(&local_38);
      Am_Object::~Am_Object(&local_50);
      if (!bVar1) goto LAB_0023d263;
      Am_Object::Am_Object(&local_60,&object);
      Am_Object::Am_Object(&local_40,&place);
      object_00 = &local_60;
      Am_Move_Object(object_00,&local_40,false);
      Am_Object::~Am_Object(&local_40);
    }
    else {
LAB_0023d263:
      Am_Object::Am_Object(&local_68,&object);
      object_00 = &local_68;
      Am_To_Top(object_00);
    }
    Am_Object::~Am_Object(object_00);
    Am_Value_List::Prev(objects);
    Am_Value_List::Prev(places);
  } while( true );
}

Assistant:

void
Am_Put_Objects_Back_In_Place(Am_Object group, Am_Value_List objects,
                             Am_Value_List places, bool add_part)
{
  //std::cout << "Put objects back into group " << group << " objects " << objects
  // << " places " << places <<std::endl <<std::flush;
  if (objects.Length() != places.Length())
    Am_Error("** Lists not the same length in put_back");
  //go through the lists backwards
  Am_Object object, place;
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ Adding parts " << objects << " to " << group);
  for (objects.End(), places.End(); !objects.First();
       objects.Prev(), places.Prev()) {
    object = objects.Get();
    place = places.Get();
    if (add_part && !object.Get_Owner().Valid())
      group.Add_Part(object);
    if (place.Valid() && place.Get_Owner() == object.Get_Owner())
      Am_Move_Object(object, place, false); //put object before place
    else
      Am_To_Top(object);
  }
}